

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

duckdb_decimal * __thiscall
duckdb::TryCastCInternal<duckdb_blob,duckdb_decimal,duckdb::FromCBlobCastWrapper>
          (duckdb_decimal *__return_storage_ptr__,duckdb *this,duckdb_result *result,idx_t col,
          idx_t row)

{
  FetchDefaultValue::Operation<duckdb_decimal>();
  return __return_storage_ptr__;
}

Assistant:

RESULT_TYPE TryCastCInternal(duckdb_result *result, idx_t col, idx_t row) {
	RESULT_TYPE result_value;
	try {
		if (!OP::template Operation<SOURCE_TYPE, RESULT_TYPE>(UnsafeFetch<SOURCE_TYPE>(result, col, row),
		                                                      result_value)) {
			return FetchDefaultValue::Operation<RESULT_TYPE>();
		}
	} catch (...) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	return result_value;
}